

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:772:27)>
::destroy(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:772:27)>
          *this)

{
  PromiseArenaMember *node;
  
  TransformPromiseNodeBase::dropDependency(&this->super_TransformPromiseNodeBase);
  (this->super_TransformPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR___cxa_pure_virtual_0061fdc8;
  node = &((this->super_TransformPromiseNodeBase).dependency.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->super_TransformPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }